

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

pair<__gnu_cxx::__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_bool>
 pdqsort_detail::
 partition_right<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
           (double *begin,double *end)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  undefined4 uVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double dVar8;
  double dVar9;
  pair<__gnu_cxx::__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_bool>
  pVar10;
  
  dVar2 = *begin;
  iVar3 = *(int *)(begin + 1);
  for (pdVar5 = (double *)0x10;
      (dVar8 = *(double *)((long)begin + (long)pdVar5), dVar8 < dVar2 ||
      ((dVar8 <= dVar2 && (*(int *)((long)(begin + 1) + (long)pdVar5) < iVar3))));
      pdVar5 = pdVar5 + 2) {
  }
  pdVar1 = (double *)((long)begin + (long)pdVar5);
  if (pdVar5 == (double *)0x10) {
    while (pdVar7 = end, end = pdVar7, pdVar1 < pdVar7) {
      end = pdVar7 + -2;
      if ((pdVar7[-2] < dVar2) || ((pdVar7[-2] <= dVar2 && (*(int *)(pdVar7 + -1) < iVar3)))) break;
    }
  }
  else {
    do {
      pdVar7 = end;
      end = pdVar7 + -2;
      if (pdVar7[-2] < dVar2) break;
    } while ((dVar2 < pdVar7[-2]) || (iVar3 <= *(int *)(pdVar7 + -1)));
  }
  pdVar7 = pdVar1;
  if (pdVar1 < end) {
    dVar9 = *end;
    pdVar5 = end;
    do {
      *pdVar7 = dVar9;
      *pdVar5 = dVar8;
      uVar4 = *(undefined4 *)(pdVar7 + 1);
      *(undefined4 *)(pdVar7 + 1) = *(undefined4 *)(pdVar5 + 1);
      *(undefined4 *)(pdVar5 + 1) = uVar4;
      do {
        do {
          pdVar6 = pdVar7;
          pdVar7 = pdVar6 + 2;
          dVar8 = *pdVar7;
        } while (dVar8 < dVar2);
      } while ((dVar8 <= dVar2) && (*(int *)(pdVar6 + 3) < iVar3));
      do {
        pdVar6 = pdVar5;
        dVar9 = pdVar6[-2];
        pdVar5 = pdVar6 + -2;
        if (dVar9 < dVar2) break;
      } while ((dVar2 < dVar9) || (iVar3 <= *(int *)(pdVar6 + -1)));
    } while (pdVar7 < pdVar5);
  }
  pVar10._9_7_ = (undefined7)((ulong)pdVar5 >> 8);
  pVar10.second = end <= pdVar1;
  *begin = pdVar7[-2];
  *(undefined4 *)(begin + 1) = *(undefined4 *)(pdVar7 + -1);
  pdVar7[-2] = dVar2;
  *(int *)(pdVar7 + -1) = iVar3;
  pVar10.first._M_current = (pair<double,_int> *)(pdVar7 + -2);
  return pVar10;
}

Assistant:

inline std::pair<Iter, bool> partition_right(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        
        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));

        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        
        // Keep swapping pairs of elements that are on the wrong side of the pivot. Previously
        // swapped pairs guard the searches, which is why the first iteration is special-cased
        // above.
        while (first < last) {
            std::iter_swap(first, last);
            while (comp(*++first, pivot));
            while (!comp(*--last, pivot));
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }